

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_horiz_rs_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn,int bd)

{
  uint16_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_R8D;
  int in_R9D;
  int k;
  int sum;
  int16_t *x_filter;
  int x_filter_idx;
  uint16_t *src_x;
  int x;
  int x_qn;
  int y;
  int in_stack_ffffffffffffffac;
  int val;
  undefined4 local_30;
  undefined4 local_28;
  undefined8 local_18;
  
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
      for (val = 0; val < 8; val = val + 1) {
      }
      uVar1 = clip_pixel_highbd(val,in_stack_ffffffffffffffac);
      *(uint16_t *)(local_18 + (long)local_30 * 2) = uVar1;
    }
    local_18 = local_18 + (long)in_ECX * 2;
  }
  return;
}

Assistant:

void av1_highbd_convolve_horiz_rs_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const int16_t *x_filters, int x0_qn,
                                    int x_step_qn, int bd) {
  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_qn = x0_qn;
    for (int x = 0; x < w; ++x) {
      const uint16_t *const src_x = &src[x_qn >> RS_SCALE_SUBPEL_BITS];
      const int x_filter_idx =
          (x_qn & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
      assert(x_filter_idx <= RS_SUBPEL_MASK);
      const int16_t *const x_filter =
          &x_filters[x_filter_idx * UPSCALE_NORMATIVE_TAPS];
      int sum = 0;
      for (int k = 0; k < UPSCALE_NORMATIVE_TAPS; ++k)
        sum += src_x[k] * x_filter[k];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      x_qn += x_step_qn;
    }
    src += src_stride;
    dst += dst_stride;
  }
}